

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# container.cpp
# Opt level: O1

void __thiscall Container::open_files(Container *this)

{
  TaskData *pTVar1;
  int iVar2;
  ContextManager *pCVar3;
  string local_38;
  
  pTVar1 = (this->task_data_).ptr_;
  if ((pTVar1->stdin_desc).filename.size_ != 0) {
    iVar2 = open((pTVar1->stdin_desc).filename.data_,0);
    (((this->task_data_).ptr_)->stdin_desc).fd = iVar2;
    if (iVar2 < 0) {
      pCVar3 = ContextManager::get();
      format_abi_cxx11_(&local_38,"Cannot open \'%s\': %m",
                        (((this->task_data_).ptr_)->stdin_desc).filename.data_);
      (**pCVar3->_vptr_ContextManager)(pCVar3,&local_38);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_38._M_dataplus._M_p != &local_38.field_2) {
        operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
      }
    }
  }
  pTVar1 = (this->task_data_).ptr_;
  if ((pTVar1->stdout_desc).filename.size_ != 0) {
    iVar2 = open((pTVar1->stdout_desc).filename.data_,0x201);
    (((this->task_data_).ptr_)->stdout_desc).fd = iVar2;
    if (iVar2 < 0) {
      pCVar3 = ContextManager::get();
      format_abi_cxx11_(&local_38,"Cannot open \'%s\': %m",
                        (((this->task_data_).ptr_)->stdout_desc).filename.data_);
      (**pCVar3->_vptr_ContextManager)(pCVar3,&local_38);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_38._M_dataplus._M_p != &local_38.field_2) {
        operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
      }
    }
  }
  pTVar1 = (this->task_data_).ptr_;
  if ((pTVar1->stderr_desc).filename.size_ != 0) {
    iVar2 = open((pTVar1->stderr_desc).filename.data_,0x201);
    (((this->task_data_).ptr_)->stderr_desc).fd = iVar2;
    if (iVar2 < 0) {
      pCVar3 = ContextManager::get();
      format_abi_cxx11_(&local_38,"Cannot open \'%s\': %m",
                        (((this->task_data_).ptr_)->stderr_desc).filename.data_);
      (**pCVar3->_vptr_ContextManager)(pCVar3,&local_38);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_38._M_dataplus._M_p != &local_38.field_2) {
        operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
      }
    }
  }
  return;
}

Assistant:

void Container::open_files() {
    if (!task_data_->stdin_desc.filename.empty()) {
        task_data_->stdin_desc.fd = open(task_data_->stdin_desc.filename.c_str(), O_RDONLY);
        if (task_data_->stdin_desc.fd < 0) {
            die(format("Cannot open '%s': %m", task_data_->stdin_desc.filename.c_str()));
        }
    }

    if (!task_data_->stdout_desc.filename.empty()) {
        task_data_->stdout_desc.fd =
            open(task_data_->stdout_desc.filename.c_str(), O_WRONLY | O_TRUNC);
        if (task_data_->stdout_desc.fd < 0) {
            die(format("Cannot open '%s': %m", task_data_->stdout_desc.filename.c_str()));
        }
    }

    if (!task_data_->stderr_desc.filename.empty()) {
        task_data_->stderr_desc.fd = open(task_data_->stderr_desc.filename.c_str(), O_WRONLY | O_TRUNC);
        if (task_data_->stderr_desc.fd < 0) {
            die(format("Cannot open '%s': %m", task_data_->stderr_desc.filename.c_str()));
        }
    }
}